

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.h
# Opt level: O0

ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
* __thiscall
slang::ast::Statement::StatementContext::enterLoop(StatementContext *this,bool isForLoop)

{
  byte in_DL;
  long in_RSI;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  *in_RDI;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  *guard;
  bitmask<slang::ast::StatementFlags> local_30;
  bitmask<slang::ast::StatementFlags> local_2c;
  anon_class_16_2_ddf078bb_for_func local_28;
  undefined1 local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  local_28.savedFlags.m_bits = *(underlying_type *)(in_RSI + 0x10);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::ScopeGuard(in_RDI,&local_28);
  bitmask<slang::ast::StatementFlags>::bitmask(&local_2c,InLoop);
  bitmask<slang::ast::StatementFlags>::operator|=
            ((bitmask<slang::ast::StatementFlags> *)(in_RSI + 0x10),&local_2c);
  if ((local_11 & 1) != 0) {
    bitmask<slang::ast::StatementFlags>::bitmask(&local_30,InForLoop);
    bitmask<slang::ast::StatementFlags>::operator|=
              ((bitmask<slang::ast::StatementFlags> *)(in_RSI + 0x10),&local_30);
  }
  return in_RDI;
}

Assistant:

[[nodiscard]] auto enterLoop(bool isForLoop = false) {
            auto guard = ScopeGuard([this, savedFlags = flags] {
                auto savableFlags = StatementFlags::InLoop | StatementFlags::InForLoop;
                flags &= ~savableFlags;
                flags |= savedFlags & savableFlags;
            });

            flags |= StatementFlags::InLoop;
            if (isForLoop)
                flags |= StatementFlags::InForLoop;

            return guard;
        }